

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocman.cpp
# Opt level: O0

Pocman * __thiscall despot::Pocman::NextPos(Pocman *this,Coord *from,int dir)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Pocman *local_3c;
  Pocman *local_34;
  Pocman *local_2c;
  Coord nextPos;
  int dir_local;
  Coord *from_local;
  Pocman *this_local;
  
  _nextPos = dir;
  despot::Coord::Coord((Coord *)&local_2c);
  if (((*(int *)from == 0) && (*(int *)(from + 4) == this->passage_y_)) && (_nextPos == 3)) {
    iVar2 = Grid<int>::xsize(&this->maze_);
    despot::Coord::Coord((Coord *)&local_34,iVar2 + -1,*(int *)(from + 4));
    local_2c = local_34;
  }
  else {
    iVar2 = *(int *)from;
    iVar3 = Grid<int>::xsize(&this->maze_);
    if (((iVar2 == iVar3 + -1) && (*(int *)(from + 4) == this->passage_y_)) && (_nextPos == 1)) {
      despot::Coord::Coord((Coord *)&local_3c,0,*(int *)(from + 4));
      local_2c = local_3c;
    }
    else {
      local_2c = (Pocman *)despot::operator+(from,(Coord *)(&Compass::DIRECTIONS + _nextPos));
    }
  }
  bVar1 = Grid<int>::Inside(&this->maze_,(Coord *)&local_2c);
  if ((bVar1) && (bVar1 = Passable(this,(Coord *)&local_2c), bVar1)) {
    this_local = local_2c;
  }
  else {
    despot::Coord::Coord((Coord *)&this_local,-1,-1);
  }
  return this_local;
}

Assistant:

Coord Pocman::NextPos(const Coord& from, int dir) const {
	Coord nextPos;
	if (from.x == 0 && from.y == passage_y_ && dir == Compass::WEST)
		nextPos = Coord(maze_.xsize() - 1, from.y);
	else if (from.x == maze_.xsize() - 1 && from.y == passage_y_
		&& dir == Compass::EAST)
		nextPos = Coord(0, from.y);
	else
		nextPos = from + Compass::DIRECTIONS[dir];

	if (maze_.Inside(nextPos) && Passable(nextPos))
		return nextPos;
	else
		return Coord(-1, -1);
}